

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

bool __thiscall NDevice::isValid(NDevice *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  int local_14;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *this_00;
  
  this_00 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if (((((uVar2 & 1) == 0) &&
       (*(int *)&in_RDI[1].super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage != -1)) &&
      (*(int *)((long)&in_RDI[1].super__Vector_base<NDeviceChannel,_std::allocator<NDeviceChannel>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) != -1)) &&
     (bVar1 = std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::empty(this_00), !bVar1))
  {
    local_14 = 0;
    while( true ) {
      iVar4 = local_14;
      sVar3 = std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::size(in_RDI + 2);
      if ((int)sVar3 <= iVar4) {
        return true;
      }
      std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::at
                (in_RDI,CONCAT44(iVar4,in_stack_ffffffffffffffd8));
      bVar1 = NDeviceChannel::isValid((NDeviceChannel *)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
      if (!bVar1) break;
      local_14 = local_14 + 1;
    }
    return false;
  }
  return false;
}

Assistant:

bool NDevice::isValid() const {
    if (name.empty() || numBytes == -1 || byteOffset == -1 || channels.empty())
        return(false); // a device must have a name, a set numBytes, a set byteOffset, and at least one channel
    for (int i = 0; i < (int)channels.size(); i++) {
        if (!channels.at(i).isValid()) //make sure all channels are valid
            return(false);
    }
    return(true);
}